

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

block * gen_linux_sll_linktype(compiler_state_t *cstate,int proto)

{
  bpf_abs_offset *abs_offset;
  slist *psVar1;
  block *pbVar2;
  block *pbVar3;
  block *b;
  slist *s;
  undefined8 local_38;
  
  if (proto < 0xfe) {
    if (proto != 6) {
      if (proto == 0xe0) {
        psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,0,0x10);
        pbVar2 = (block *)newchunk(cstate,0x120);
        (pbVar2->s).code = 0x15;
        pbVar2->head = pbVar2;
        pbVar2->stmts = psVar1;
        (pbVar2->s).k = 0xe0;
        local_38 = 0x378100000003aaaa;
        pbVar3 = gen_bcmp(cstate,OR_LLC,0,8,(u_char *)&local_38);
        gen_or(pbVar2,pbVar3);
        abs_offset = &cstate->off_linktype;
        psVar1 = gen_load_absoffsetrel(cstate,abs_offset,0,8);
        pbVar2 = (block *)newchunk(cstate,0x120);
        (pbVar2->s).code = 0x15;
        pbVar2->head = pbVar2;
        pbVar2->stmts = psVar1;
        (pbVar2->s).k = 4;
        gen_and(pbVar2,pbVar3);
        psVar1 = gen_load_absoffsetrel(cstate,abs_offset,0,8);
        pbVar2 = (block *)newchunk(cstate,0x120);
        (pbVar2->s).code = 0x15;
        pbVar2->head = pbVar2;
        pbVar2->stmts = psVar1;
        (pbVar2->s).k = 1;
        gen_or(pbVar2,pbVar3);
        psVar1 = gen_load_absoffsetrel(cstate,abs_offset,0,8);
        pbVar2 = (block *)newchunk(cstate,0x120);
        (pbVar2->s).code = 0x15;
        pbVar2->head = pbVar2;
        pbVar2->stmts = psVar1;
        (pbVar2->s).k = 0x8137;
        goto LAB_00111fa6;
      }
      if (proto != 0xf0) goto LAB_00111c3a;
    }
  }
  else {
    if ((proto == 0x80f3) || (proto == 0x809b)) {
      psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
      pbVar2 = (block *)newchunk(cstate,0x120);
      (pbVar2->s).code = 0x15;
      pbVar2->head = pbVar2;
      pbVar2->stmts = psVar1;
      (pbVar2->s).k = 4;
      if (proto == 0x809b) {
        local_38 = 0x9b8007000803aaaa;
      }
      else {
        local_38 = 0xf38000000003aaaa;
      }
      pbVar3 = gen_bcmp(cstate,OR_LLC,0,8,(u_char *)&local_38);
      gen_and(pbVar2,pbVar3);
      psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
      pbVar2 = (block *)newchunk(cstate,0x120);
      (pbVar2->s).code = 0x15;
      pbVar2->head = pbVar2;
      pbVar2->stmts = psVar1;
      (pbVar2->s).k = proto;
LAB_00111fa6:
      gen_or(pbVar2,pbVar3);
      return pbVar3;
    }
    if (proto != 0xfe) {
LAB_00111c3a:
      psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
      pbVar2 = (block *)newchunk(cstate,0x120);
      (pbVar2->s).code = 0x15;
      pbVar2->head = pbVar2;
      pbVar2->stmts = psVar1;
      if (proto < 0x5dd) {
        (pbVar2->s).k = 4;
        psVar1 = gen_load_absoffsetrel
                           (cstate,&cstate->off_linkhdr,(cstate->off_linkpl).constant_part,0x10);
        pbVar3 = (block *)newchunk(cstate,0x120);
        (pbVar3->s).code = 0x15;
        pbVar3->head = pbVar3;
        pbVar3->stmts = psVar1;
        (pbVar3->s).k = proto;
        gen_and(pbVar2,pbVar3);
        return pbVar3;
      }
      (pbVar2->s).k = proto;
      return pbVar2;
    }
  }
  psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
  pbVar2 = (block *)newchunk(cstate,0x120);
  (pbVar2->s).code = 0x15;
  pbVar2->head = pbVar2;
  pbVar2->stmts = psVar1;
  (pbVar2->s).k = 4;
  psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,0,8);
  pbVar3 = (block *)newchunk(cstate,0x120);
  (pbVar3->s).code = 0x15;
  pbVar3->head = pbVar3;
  pbVar3->stmts = psVar1;
  (pbVar3->s).k = proto << 8 | proto;
  gen_and(pbVar2,pbVar3);
  return pbVar3;
}

Assistant:

static struct block *
gen_linux_sll_linktype(compiler_state_t *cstate, int proto)
{
	struct block *b0, *b1;

	switch (proto) {

	case LLCSAP_ISONS:
	case LLCSAP_IP:
	case LLCSAP_NETBEUI:
		/*
		 * OSI protocols and NetBEUI always use 802.2 encapsulation,
		 * so we check the DSAP and SSAP.
		 *
		 * LLCSAP_IP checks for IP-over-802.2, rather
		 * than IP-over-Ethernet or IP-over-SNAP.
		 *
		 * XXX - should we check both the DSAP and the
		 * SSAP, like this, or should we check just the
		 * DSAP, as we do for other types <= ETHERMTU
		 * (i.e., other SAP values)?
		 */
		b0 = gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H, LINUX_SLL_P_802_2);
		b1 = gen_cmp(cstate, OR_LLC, 0, BPF_H, (bpf_int32)
			     ((proto << 8) | proto));
		gen_and(b0, b1);
		return b1;

	case LLCSAP_IPX:
		/*
		 *	Ethernet_II frames, which are Ethernet
		 *	frames with a frame type of ETHERTYPE_IPX;
		 *
		 *	Ethernet_802.3 frames, which have a frame
		 *	type of LINUX_SLL_P_802_3;
		 *
		 *	Ethernet_802.2 frames, which are 802.3
		 *	frames with an 802.2 LLC header (i.e, have
		 *	a frame type of LINUX_SLL_P_802_2) and
		 *	with the IPX LSAP as the DSAP in the LLC
		 *	header;
		 *
		 *	Ethernet_SNAP frames, which are 802.3
		 *	frames with an LLC header and a SNAP
		 *	header and with an OUI of 0x000000
		 *	(encapsulated Ethernet) and a protocol
		 *	ID of ETHERTYPE_IPX in the SNAP header.
		 *
		 * First, do the checks on LINUX_SLL_P_802_2
		 * frames; generate the check for either
		 * Ethernet_802.2 or Ethernet_SNAP frames, and
		 * then put a check for LINUX_SLL_P_802_2 frames
		 * before it.
		 */
		b0 = gen_cmp(cstate, OR_LLC, 0, BPF_B, (bpf_int32)LLCSAP_IPX);
		b1 = gen_snap(cstate, 0x000000, ETHERTYPE_IPX);
		gen_or(b0, b1);
		b0 = gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H, LINUX_SLL_P_802_2);
		gen_and(b0, b1);

		/*
		 * Now check for 802.3 frames and OR that with
		 * the previous test.
		 */
		b0 = gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H, LINUX_SLL_P_802_3);
		gen_or(b0, b1);

		/*
		 * Now add the check for Ethernet_II frames, and
		 * do that before checking for the other frame
		 * types.
		 */
		b0 = gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H, (bpf_int32)ETHERTYPE_IPX);
		gen_or(b0, b1);
		return b1;

	case ETHERTYPE_ATALK:
	case ETHERTYPE_AARP:
		/*
		 * EtherTalk (AppleTalk protocols on Ethernet link
		 * layer) may use 802.2 encapsulation.
		 */

		/*
		 * Check for 802.2 encapsulation (EtherTalk phase 2?);
		 * we check for the 802.2 protocol type in the
		 * "Ethernet type" field.
		 */
		b0 = gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H, LINUX_SLL_P_802_2);

		/*
		 * 802.2-encapsulated ETHERTYPE_ATALK packets are
		 * SNAP packets with an organization code of
		 * 0x080007 (Apple, for Appletalk) and a protocol
		 * type of ETHERTYPE_ATALK (Appletalk).
		 *
		 * 802.2-encapsulated ETHERTYPE_AARP packets are
		 * SNAP packets with an organization code of
		 * 0x000000 (encapsulated Ethernet) and a protocol
		 * type of ETHERTYPE_AARP (Appletalk ARP).
		 */
		if (proto == ETHERTYPE_ATALK)
			b1 = gen_snap(cstate, 0x080007, ETHERTYPE_ATALK);
		else	/* proto == ETHERTYPE_AARP */
			b1 = gen_snap(cstate, 0x000000, ETHERTYPE_AARP);
		gen_and(b0, b1);

		/*
		 * Check for Ethernet encapsulation (Ethertalk
		 * phase 1?); we just check for the Ethernet
		 * protocol type.
		 */
		b0 = gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H, (bpf_int32)proto);

		gen_or(b0, b1);
		return b1;

	default:
		if (proto <= ETHERMTU) {
			/*
			 * This is an LLC SAP value, so the frames
			 * that match would be 802.2 frames.
			 * Check for the 802.2 protocol type
			 * in the "Ethernet type" field, and
			 * then check the DSAP.
			 */
			b0 = gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H, LINUX_SLL_P_802_2);
			b1 = gen_cmp(cstate, OR_LINKHDR, cstate->off_linkpl.constant_part, BPF_B,
			     (bpf_int32)proto);
			gen_and(b0, b1);
			return b1;
		} else {
			/*
			 * This is an Ethernet type, so compare
			 * the length/type field with it (if
			 * the frame is an 802.2 frame, the length
			 * field will be <= ETHERMTU, and, as
			 * "proto" is > ETHERMTU, this test
			 * will fail and the frame won't match,
			 * which is what we want).
			 */
			return gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H, (bpf_int32)proto);
		}
	}
}